

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_32x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  int8_t *piVar2;
  undefined7 in_register_00000009;
  undefined8 uVar3;
  int in_R9D;
  int shift;
  ulong uVar4;
  long lVar5;
  int in_stack_fffffffffffff7b8;
  __m128i in [128];
  
  piVar2 = av1_fwd_txfm_shift_ls[10];
  uVar4 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)col_highbd_txfm8x32_arr + uVar4);
  uVar3 = 0x10;
  load_buffer_32x8n(input,in,stride,(int)*av1_fwd_txfm_shift_ls[10],0x10,in_R9D,
                    in_stack_fffffffffffff7b8);
  (**(code **)((long)row_highbd_txfm8x32_arr + uVar4))(in,in,0xd,8);
  shift = -(int)piVar2[1];
  col_txfm_16x16_rounding(in,shift);
  col_txfm_16x16_rounding(in + 0x40,shift);
  transpose_8nx8n(in,(__m128i *)coeff,0x20,0x10);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    (*pcVar1)((long)coeff + lVar5,(long)in[0] + lVar5,0xd,4);
  }
  av1_round_shift_rect_array_32_sse4_1(in,(__m128i *)coeff,0x80,-(int)piVar2[2],(int)uVar3);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 16);
  col_txfm(in, in, bitcol, 8);
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 32, 16);

  // row transform
  for (int i = 0; i < 4; i++) {
    row_txfm((outcoef128 + i), (in + i), bitrow, 4);
  }
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}